

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O0

void __thiscall rlib::sequencer::MmlCompiler::EventMeta::~EventMeta(EventMeta *this)

{
  Event *in_RDI;
  
  in_RDI->_vptr_Event = (_func_int **)&PTR__EventMeta_0024bce8;
  std::__cxx11::string::~string((string *)&in_RDI[1].position);
  Event::~Event(in_RDI);
  return;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventMeta>(*this);
			}